

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssa_rewrite_pass.cpp
# Opt level: O1

Status __thiscall spvtools::opt::SSARewriter::RewriteFunctionIntoSSA(SSARewriter *this,Function *fp)

{
  IRContext *this_00;
  bool bVar1;
  Status SVar2;
  _Any_data local_48;
  code *local_38;
  code *pcStack_30;
  
  MemPass::CollectTargetVars(this->pass_,fp);
  this_00 = (this->pass_->super_Pass).context_;
  if ((this_00->valid_analyses_ & kAnalysisCFG) == kAnalysisNone) {
    IRContext::BuildCFG(this_00);
  }
  local_48._8_8_ = 0;
  pcStack_30 = std::
               _Function_handler<bool_(spvtools::opt::BasicBlock_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/ssa_rewrite_pass.cpp:662:26)>
               ::_M_invoke;
  local_38 = std::
             _Function_handler<bool_(spvtools::opt::BasicBlock_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/ssa_rewrite_pass.cpp:662:26)>
             ::_M_manager;
  local_48._M_unused._M_object = this;
  bVar1 = CFG::WhileEachBlockInReversePostOrder
                    ((this_00->cfg_)._M_t.
                     super___uniq_ptr_impl<spvtools::opt::CFG,_std::default_delete<spvtools::opt::CFG>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_spvtools::opt::CFG_*,_std::default_delete<spvtools::opt::CFG>_>
                     .super__Head_base<0UL,_spvtools::opt::CFG_*,_false>._M_head_impl,
                     (BasicBlock *)
                     (((fp->blocks_).
                       super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start)->_M_t).
                     super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
                     ._M_t,(function<bool_(spvtools::opt::BasicBlock_*)> *)&local_48);
  if (local_38 != (code *)0x0) {
    (*local_38)(&local_48,&local_48,__destroy_functor);
  }
  SVar2 = Failure;
  if (bVar1) {
    FinalizePhiCandidates(this);
    bVar1 = ApplyReplacements(this);
    SVar2 = bVar1 ^ SuccessWithoutChange;
  }
  return SVar2;
}

Assistant:

Pass::Status SSARewriter::RewriteFunctionIntoSSA(Function* fp) {
#if SSA_REWRITE_DEBUGGING_LEVEL > 0
  std::cerr << "Function before SSA rewrite:\n"
            << fp->PrettyPrint(0) << "\n\n\n";
#endif

  // Collect variables that can be converted into SSA IDs.
  pass_->CollectTargetVars(fp);

  // Generate all the SSA replacements and Phi candidates. This will
  // generate incomplete and trivial Phis.
  bool succeeded = pass_->cfg()->WhileEachBlockInReversePostOrder(
      fp->entry().get(), [this](BasicBlock* bb) {
        if (!GenerateSSAReplacements(bb)) {
          return false;
        }
        return true;
      });

  if (!succeeded) {
    return Pass::Status::Failure;
  }

  // Remove trivial Phis and add arguments to incomplete Phis.
  FinalizePhiCandidates();

  // Finally, apply all the replacements in the IR.
  bool modified = ApplyReplacements();

#if SSA_REWRITE_DEBUGGING_LEVEL > 0
  std::cerr << "\n\n\nFunction after SSA rewrite:\n"
            << fp->PrettyPrint(0) << "\n";
#endif

  return modified ? Pass::Status::SuccessWithChange
                  : Pass::Status::SuccessWithoutChange;
}